

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.hpp
# Opt level: O1

void __thiscall
LLVMBC::LLVMContext::TypedDeleter<LLVMBC::Module>::run(TypedDeleter<LLVMBC::Module> *this)

{
  Module *pMVar1;
  pointer ptr;
  pointer ptr_00;
  pointer ptr_01;
  
  pMVar1 = this->ptr;
  ptr = (pMVar1->unnamed_metadata).
        super__Vector_base<LLVMBC::MDNode_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::MDNode_*>_>.
        _M_impl.super__Vector_impl_data._M_start;
  if (ptr != (pointer)0x0) {
    ::dxil_spv::free_in_thread(ptr);
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_LLVMBC::NamedMDNode_*>,_dxil_spv::ThreadLocalAllocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_LLVMBC::NamedMDNode_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&(pMVar1->named_metadata)._M_h);
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(pMVar1->value_symtab)._M_h);
  ptr_00 = (pMVar1->globals).
           super__Vector_base<LLVMBC::GlobalVariable_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::GlobalVariable_*>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (ptr_00 != (pointer)0x0) {
    ::dxil_spv::free_in_thread(ptr_00);
  }
  ptr_01 = (pMVar1->functions).
           super__Vector_base<LLVMBC::Function_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Function_*>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (ptr_01 != (pointer)0x0) {
    ::dxil_spv::free_in_thread(ptr_01);
    return;
  }
  return;
}

Assistant:

void run() override
		{
			ptr->~T();
		}